

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.c
# Opt level: O2

void icetMatrixRotate(IceTDouble angle,IceTDouble x,IceTDouble y,IceTDouble z,IceTDouble *mat_out)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  double dVar8;
  
  dVar3 = SQRT((double)z * (double)z + (double)x * (double)x + (double)y * (double)y);
  dVar4 = (double)z / dVar3;
  dVar1 = cos((double)angle * 0.017453292519943295);
  dVar2 = sin((double)angle * 0.017453292519943295);
  dVar5 = 1.0 - dVar1;
  auVar6._8_8_ = y;
  auVar6._0_8_ = x;
  auVar7._8_8_ = dVar3;
  auVar7._0_8_ = dVar3;
  auVar7 = divpd(auVar6,auVar7);
  dVar3 = auVar7._0_8_;
  dVar8 = auVar7._8_8_;
  *mat_out = (IceTDouble)(dVar3 * dVar3 * dVar5 + dVar1);
  mat_out[1] = (IceTDouble)(dVar3 * dVar8 * dVar5 + dVar4 * dVar2);
  mat_out[3] = 0.0;
  mat_out[4] = (IceTDouble)(dVar3 * dVar8 * dVar5 + -(dVar4 * dVar2));
  mat_out[5] = (IceTDouble)(dVar8 * dVar8 * dVar5 + dVar1);
  mat_out[7] = 0.0;
  mat_out[2] = (IceTDouble)(dVar4 * dVar3 * dVar5 - dVar8 * dVar2);
  mat_out[6] = (IceTDouble)(dVar4 * dVar8 * dVar5 + dVar2 * dVar3);
  mat_out[8] = (IceTDouble)(dVar4 * dVar3 * dVar5 + dVar8 * dVar2);
  mat_out[9] = (IceTDouble)(dVar4 * dVar8 * dVar5 + -(dVar2 * dVar3));
  mat_out[10] = (IceTDouble)(dVar4 * dVar4 * dVar5 + dVar1);
  mat_out[0xb] = 0.0;
  mat_out[0xc] = 0.0;
  mat_out[0xd] = 0.0;
  mat_out[0xe] = 0.0;
  mat_out[0xf] = 1.0;
  return;
}

Assistant:

ICET_EXPORT void icetMatrixRotate(IceTDouble angle,
                                  IceTDouble x, IceTDouble y, IceTDouble z,
                                  IceTDouble *mat_out)
{
    IceTDouble v[3];
    IceTDouble length;
    IceTDouble c;
    IceTDouble s;

    v[0] = x;  v[1] = y;  v[2] = z;
    length = sqrt(icetDot3(v, v));
    v[0] /= length;  v[1] /= length;  v[2] /= length;

    c = cos((M_PI/180.0)*angle);
    s = sin((M_PI/180.0)*angle);

    mat_out[ 0] = v[0]*v[0]*(1-c) + c;
    mat_out[ 1] = v[0]*v[1]*(1-c) + v[2]*s;
    mat_out[ 2] = v[0]*v[2]*(1-c) - v[1]*s;
    mat_out[ 3] = 0.0;

    mat_out[ 4] = v[0]*v[1]*(1-c) - v[2]*s;
    mat_out[ 5] = v[1]*v[1]*(1-c) + c;
    mat_out[ 6] = v[1]*v[2]*(1-c) + v[0]*s;
    mat_out[ 7] = 0.0;

    mat_out[ 8] = v[0]*v[2]*(1-c) + v[1]*s;
    mat_out[ 9] = v[1]*v[2]*(1-c) - v[0]*s;
    mat_out[10] = v[2]*v[2]*(1-c) + c;
    mat_out[11] = 0.0;

    mat_out[12] = 0.0;
    mat_out[13] = 0.0;
    mat_out[14] = 0.0;
    mat_out[15] = 1.0;
}